

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmq.hpp
# Opt level: O1

int __thiscall zmq::detail::socket_base::get<13,int,true>(socket_base *this)

{
  int val;
  size_t size;
  int local_14;
  size_t local_10;
  
  local_10 = 4;
  get_option(this,0xd,&local_14,&local_10);
  if (local_10 == 4) {
    return local_14;
  }
  __assert_fail("size == sizeof val",
                "/workspace/llm4binary/github/license_c_cmakelists/zeromq[P]cppzmq/zmq.hpp",0x72c,
                "T zmq::detail::socket_base::get(sockopt::integral_option<Opt, T, BoolUnit>) const [Opt = 13, T = int, BoolUnit = true]"
               );
}

Assistant:

ZMQ_NODISCARD T get(sockopt::integral_option<Opt, T, BoolUnit>) const
    {
        static_assert(std::is_scalar<T>::value, "T must be scalar");
        T val;
        size_t size = sizeof val;
        get_option(Opt, &val, &size);
        assert(size == sizeof val);
        return val;
    }